

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFrameworkMultiConfigPostfix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  string configProp;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  if (config->_M_string_length != 0) {
    local_50.View_._M_len = 0x1f;
    local_50.View_._M_str = "FRAMEWORK_MULTI_CONFIG_POSTFIX_";
    cmsys::SystemTools::UpperCase(&local_a0,config);
    local_80.View_._M_len = local_a0._M_string_length;
    local_80.View_._M_str = local_a0._M_dataplus._M_p;
    cmStrCat<>(&local_c0,&local_50,&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    cVar3 = GetProperty(this,&local_c0);
    bVar1 = IsImported(this);
    if (!bVar1) {
      if (cVar3.Value == (string *)0x0) {
        cVar3.Value = (string *)0x0;
      }
      else {
        bVar1 = IsFrameworkOnApple(this);
        if (bVar1) {
          iVar2 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
          if ((char)iVar2 == '\0') {
            cVar3.Value = (string *)0x0;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_c0);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar3.Value);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkMultiConfigPostfix(
  const std::string& config) const
{
  cmValue postfix = nullptr;
  if (!config.empty()) {
    std::string configProp = cmStrCat("FRAMEWORK_MULTI_CONFIG_POSTFIX_",
                                      cmSystemTools::UpperCase(config));
    postfix = this->GetProperty(configProp);

    if (!this->IsImported() && postfix &&
        (this->IsFrameworkOnApple() &&
         !this->GetGlobalGenerator()->IsMultiConfig())) {
      postfix = nullptr;
    }
  }
  return postfix ? *postfix : std::string();
}